

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O1

void bson_copy_to(bson_t *src,bson_t *dst)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  void *__dest;
  char *__s1;
  undefined8 *in_RCX;
  long lVar5;
  long *plVar6;
  bson_iter_t *pbVar7;
  char *first_exclude;
  char *extraout_RDX;
  char *first_exclude_00;
  bson_t *unaff_RBX;
  uint32_t uVar8;
  char *__s2;
  bson_t *dst_00;
  bson_t *pbVar9;
  size_t num_bytes;
  long *plVar10;
  uint uVar11;
  bson_impl_alloc_t *impl;
  __va_list_tag _Stack_3d8;
  undefined1 auStack_3b8 [24];
  bson_iter_t *pbStack_3a0;
  code *pcStack_308;
  undefined1 auStack_2f8 [72];
  undefined8 uStack_2b0;
  long *plStack_2a8;
  long lStack_2a0;
  bson_t *pbStack_298;
  undefined8 *puStack_290;
  char *pcStack_288;
  bson_iter_t abStack_280 [4];
  bson_t *pbStack_130;
  __va_list_tag _Stack_100;
  undefined1 auStack_e0 [176];
  code *pcStack_30;
  
  if (src == (bson_t *)0x0) {
    pcStack_30 = (code *)0x10d36b;
    bson_copy_to_cold_2();
  }
  else {
    unaff_RBX = dst;
    if (dst != (bson_t *)0x0) {
      if ((src->flags & 1) == 0) {
        lVar5 = **(long **)(src->padding + 0x10);
        lVar1 = *(long *)(src->padding + 0x20);
        uVar11 = src->len;
        dst->flags = 2;
        dst->len = uVar11;
        uVar4 = (ulong)uVar11 - 1;
        uVar4 = uVar4 >> 1 | uVar4;
        uVar4 = uVar4 >> 2 | uVar4;
        uVar4 = uVar4 >> 4 | uVar4;
        uVar4 = uVar4 >> 8 | uVar4;
        uVar4 = uVar4 >> 0x10 | uVar4;
        num_bytes = (uVar4 >> 0x20 | uVar4) + 1;
        dst->padding[0] = '\0';
        dst->padding[1] = '\0';
        dst->padding[2] = '\0';
        dst->padding[3] = '\0';
        dst->padding[4] = '\0';
        dst->padding[5] = '\0';
        dst->padding[6] = '\0';
        dst->padding[7] = '\0';
        dst->padding[8] = '\0';
        dst->padding[9] = '\0';
        dst->padding[10] = '\0';
        dst->padding[0xb] = '\0';
        *(uint8_t **)(dst->padding + 0x10) = dst->padding + 0x28;
        *(uint8_t **)(dst->padding + 0x18) = dst->padding + 0x30;
        dst->padding[0x20] = '\0';
        dst->padding[0x21] = '\0';
        dst->padding[0x22] = '\0';
        dst->padding[0x23] = '\0';
        dst->padding[0x24] = '\0';
        dst->padding[0x25] = '\0';
        dst->padding[0x26] = '\0';
        dst->padding[0x27] = '\0';
        pcStack_30 = (code *)0x10d319;
        __dest = bson_malloc(num_bytes);
        *(void **)(dst->padding + 0x28) = __dest;
        *(size_t *)(dst->padding + 0x30) = num_bytes;
        *(code **)(dst->padding + 0x38) = bson_realloc_ctx;
        dst->padding[0x40] = '\0';
        dst->padding[0x41] = '\0';
        dst->padding[0x42] = '\0';
        dst->padding[0x43] = '\0';
        dst->padding[0x44] = '\0';
        dst->padding[0x45] = '\0';
        dst->padding[0x46] = '\0';
        dst->padding[0x47] = '\0';
        memcpy(__dest,(void *)(lVar5 + lVar1),(ulong)src->len);
        return;
      }
      pbVar9 = dst;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        uVar8 = src->len;
        pbVar9->flags = src->flags;
        pbVar9->len = uVar8;
        src = (bson_t *)src->padding;
        pbVar9 = (bson_t *)pbVar9->padding;
      }
      dst->flags = 3;
      return;
    }
  }
  pcStack_30 = bson_copy_to_excluding;
  bson_copy_to_cold_1();
  if (src == (bson_t *)0x0) {
    bson_copy_to_excluding_cold_3();
  }
  else if (dst != (bson_t *)0x0) {
    if (first_exclude != (char *)0x0) {
      dst->flags = 3;
      dst->len = 5;
      dst->padding[0] = '\x05';
      dst->padding[1] = '\0';
      dst->padding[2] = '\0';
      dst->padding[3] = '\0';
      dst->padding[4] = '\0';
      _Stack_100.reg_save_area = auStack_e0;
      _Stack_100.overflow_arg_area = &stack0xffffffffffffffe0;
      _Stack_100.gp_offset = 0x18;
      _Stack_100.fp_offset = 0x30;
      _bson_copy_to_excluding_va(src,dst,first_exclude,&_Stack_100);
      return;
    }
    goto LAB_0010d424;
  }
  bson_copy_to_excluding_cold_2();
LAB_0010d424:
  bson_copy_to_excluding_cold_1();
  pcStack_308 = (code *)0x10d460;
  pbStack_298 = dst;
  puStack_290 = in_RCX;
  pcStack_288 = extraout_RDX;
  pbStack_130 = unaff_RBX;
  _Var2 = bson_iter_init(abStack_280,src);
  if (_Var2) {
    pcStack_308 = (code *)0x10d475;
    _Var2 = bson_iter_next(abStack_280);
    if (_Var2) {
      do {
        pcStack_308 = (code *)0x10d490;
        __s1 = bson_iter_key(abStack_280);
        uStack_2b0 = *puStack_290;
        plStack_2a8 = (long *)puStack_290[1];
        lVar5 = puStack_290[2];
        __s2 = pcStack_288;
        plVar10 = plStack_2a8;
        uVar11 = (uint)uStack_2b0;
        lStack_2a0 = lVar5;
        do {
          pcStack_308 = (code *)0x10d4c0;
          iVar3 = strcmp(__s1,__s2);
          if (iVar3 == 0) goto LAB_0010d515;
          if (uVar11 < 0x29) {
            uVar4 = (ulong)uVar11;
            uVar11 = uVar11 + 8;
            uStack_2b0 = CONCAT44(uStack_2b0._4_4_,uVar11);
            plVar6 = plVar10;
            plVar10 = (long *)(uVar4 + lVar5);
          }
          else {
            plVar6 = plVar10 + 1;
            plStack_2a8 = plVar6;
          }
          __s2 = (char *)*plVar10;
          plVar10 = plVar6;
        } while (__s2 != (char *)0x0);
        if (iVar3 != 0) {
          dst_00 = (bson_t *)0x0;
          pcStack_308 = (code *)0x10d50c;
          pbVar7 = abStack_280;
          pbVar9 = pbStack_298;
          _Var2 = bson_append_iter(pbStack_298,(char *)0x0,0,abStack_280);
          if (!_Var2) {
            pcStack_308 = bson_copy_to_excluding_noinit;
            _bson_copy_to_excluding_va_cold_1();
            pbStack_3a0 = pbVar7;
            if (pbVar9 == (bson_t *)0x0) {
              bson_copy_to_excluding_noinit_cold_3();
            }
            else if (dst_00 != (bson_t *)0x0) {
              if (first_exclude_00 != (char *)0x0) {
                _Stack_3d8.reg_save_area = auStack_3b8;
                _Stack_3d8.overflow_arg_area = auStack_2f8;
                _Stack_3d8.gp_offset = 0x18;
                _Stack_3d8.fp_offset = 0x30;
                _bson_copy_to_excluding_va(pbVar9,dst_00,first_exclude_00,&_Stack_3d8);
                return;
              }
              goto LAB_0010d5d5;
            }
            bson_copy_to_excluding_noinit_cold_2();
LAB_0010d5d5:
            uVar8 = (uint32_t)dst_00;
            bson_copy_to_excluding_noinit_cold_1();
            if (((pbVar9->flags & 0x1c) == 0) && (_Var2 = _bson_grow(pbVar9,uVar8), _Var2)) {
              pbVar9->len = uVar8;
            }
            return;
          }
        }
LAB_0010d515:
        pcStack_308 = (code *)0x10d51d;
        _Var2 = bson_iter_next(abStack_280);
      } while (_Var2);
    }
  }
  return;
}

Assistant:

void
bson_copy_to (const bson_t *src, bson_t *dst)
{
   const uint8_t *data;
   bson_impl_alloc_t *adst;
   size_t len;

   BSON_ASSERT (src);
   BSON_ASSERT (dst);

   if ((src->flags & BSON_FLAG_INLINE)) {
      memcpy (dst, src, sizeof *dst);
      dst->flags = (BSON_FLAG_STATIC | BSON_FLAG_INLINE);
      return;
   }

   data = _bson_data (src);
   len = bson_next_power_of_two ((size_t) src->len);

   adst = (bson_impl_alloc_t *) dst;
   adst->flags = BSON_FLAG_STATIC;
   adst->len = src->len;
   adst->parent = NULL;
   adst->depth = 0;
   adst->buf = &adst->alloc;
   adst->buflen = &adst->alloclen;
   adst->offset = 0;
   adst->alloc = bson_malloc (len);
   adst->alloclen = len;
   adst->realloc = bson_realloc_ctx;
   adst->realloc_func_ctx = NULL;
   memcpy (adst->alloc, data, src->len);
}